

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
OneWireSimulationDataGenerator::SimWriteByte(OneWireSimulationDataGenerator *this,U32 byte)

{
  uint local_1c;
  U32 mask_result;
  U32 i;
  U32 mask;
  U32 byte_local;
  OneWireSimulationDataGenerator *this_local;
  
  mask_result = 1;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    if ((byte & mask_result) == 0) {
      SimWriteBit(this,0);
    }
    else {
      SimWriteBit(this,1);
    }
    mask_result = mask_result << 1;
  }
  if ((this->mSimOverdrive & 1U) == 1) {
    UsToSamples(this,0xc);
    SimulationChannelDescriptor::Advance((int)this + 0x18);
  }
  else {
    UsToSamples(this,0x78);
    SimulationChannelDescriptor::Advance((int)this + 0x18);
  }
  return;
}

Assistant:

void OneWireSimulationDataGenerator::SimWriteByte( U32 byte )
{
    // LSB first
    U32 mask = 1;
    for( U32 i = 0; i < 8; i++ )
    {
        U32 mask_result = byte & mask;
        if( mask_result != 0 )
            SimWriteBit( BIT_HIGH );
        else
            SimWriteBit( BIT_LOW );
        mask = mask << 1;
    }
    if( mSimOverdrive == true )
        // mSimulationSampleIndex += UsToSamples( 12 );
        mOneWireSimulationData.Advance( U32( UsToSamples( 12 ) ) );
    else
        // mSimulationSampleIndex += UsToSamples(120 );
        mOneWireSimulationData.Advance( U32( UsToSamples( 120 ) ) );
}